

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_compute_branch(DisasContext_conflict14 *ctx,uint32_t opc,int r1,int r2,int32_t constant,
                       int32_t offset)

{
  uint32_t uVar1;
  uint uVar2;
  TCGContext_conflict9 *tcg_ctx;
  TCGv_i32 ret;
  TCGv_i32 pTVar3;
  TCGv_i32 pTVar4;
  int offset_00;
  uintptr_t o_2;
  TCGCond TVar5;
  uintptr_t o;
  uintptr_t o_3;
  int16_t address;
  target_ulong_conflict dest;
  TCGTemp *local_38;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  address = (int16_t)offset;
  switch(opc) {
  case 0x5c:
  case 0x6d:
    pTVar4 = tcg_const_i32_tricore(tcg_ctx,ctx->pc_succ_insn);
    gen_helper_call(tcg_ctx,tcg_ctx->cpu_env,pTVar4);
    tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
    break;
  case 0x5d:
    tcg_gen_movi_i32(tcg_ctx,tcg_ctx->cpu_gpr_a[0xb],ctx->pc_succ_insn);
    break;
  case 0x5e:
    pTVar4 = tcg_ctx->cpu_gpr_d[0xf];
    goto LAB_00b4a4dd;
  case 0x5f:
    pTVar4 = tcg_ctx->cpu_gpr_d[(uint)r1];
    pTVar3 = tcg_ctx->cpu_gpr_d[(uint)r2];
    if ((int)ctx->opcode < 0) goto LAB_00b4a587;
LAB_00b4a75e:
    address = (int16_t)offset;
    TVar5 = TCG_COND_EQ;
    goto LAB_00b4a764;
  case 0x60:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
switchD_00b4a389_caseD_f7:
    generate_trap(ctx,2,1);
    goto LAB_00b4a948;
  case 0x61:
    gen_fcall_save_ctx(ctx);
    break;
  case 0x6e:
    pTVar4 = tcg_ctx->cpu_gpr_d[0xf];
LAB_00b4a8a4:
    TVar5 = TCG_COND_EQ;
LAB_00b4a8b2:
    constant = 0;
    goto LAB_00b4a8b8;
  case 0x6f:
    uVar2 = ctx->opcode;
    pTVar3 = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_andi_i32_tricore
              (tcg_ctx,pTVar3,tcg_ctx->cpu_gpr_d[(uint)r1],
               1 << ((byte)(uVar2 >> 3) & 0x10 | (byte)(uVar2 >> 0xc) & 0xf));
    TVar5 = ~ctx->opcode >> 0x1f ^ TCG_COND_NE;
    constant = 0;
LAB_00b4a935:
    gen_branch_condi(ctx,TVar5,pTVar3,constant,address);
    goto LAB_00b4a943;
  default:
    switch(opc) {
    case 0x76:
      pTVar4 = tcg_ctx->cpu_gpr_d[(uint)r1];
      goto LAB_00b4a8a4;
    case 0x77:
    case 0x78:
    case 0x79:
    case 0x7a:
    case 0x7b:
      goto switchD_00b4a389_caseD_f7;
    case 0x7c:
      pTVar4 = tcg_ctx->cpu_gpr_a[(uint)r1];
LAB_00b4a8ac:
      TVar5 = TCG_COND_NE;
      goto LAB_00b4a8b2;
    case 0x7d:
      pTVar4 = tcg_ctx->cpu_gpr_a[(uint)r1];
      pTVar3 = tcg_ctx->cpu_gpr_a[(uint)r2];
      if (-1 < (int)ctx->opcode) goto LAB_00b4a75e;
      break;
    case 0x7e:
      pTVar4 = tcg_ctx->cpu_gpr_d[(uint)r1];
      pTVar3 = tcg_ctx->cpu_gpr_d[0xf];
      break;
    case 0x7f:
      pTVar4 = tcg_ctx->cpu_gpr_d[(uint)r1];
      pTVar3 = tcg_ctx->cpu_gpr_d[(uint)r2];
      if ((int)ctx->opcode < 0) {
        TVar5 = TCG_COND_GEU;
      }
      else {
        TVar5 = TCG_COND_GE;
      }
      goto LAB_00b4a764;
    default:
      switch(opc) {
      case 0xdc:
        tcg_gen_andi_i32_tricore(tcg_ctx,tcg_ctx->cpu_PC,tcg_ctx->cpu_gpr_a[(uint)r1],-2);
LAB_00b4a3e1:
        tcg_gen_exit_tb_tricore(tcg_ctx,(TranslationBlock *)0x0,0);
        goto LAB_00b4a948;
      case 0xdd:
        tcg_gen_movi_i32(tcg_ctx,tcg_ctx->cpu_gpr_a[0xb],ctx->pc_succ_insn);
        goto LAB_00b4a701;
      case 0xde:
        pTVar4 = tcg_ctx->cpu_gpr_d[0xf];
        offset = offset + 0x10;
        break;
      case 0xdf:
        pTVar4 = tcg_ctx->cpu_gpr_d[(uint)r1];
        if (-1 < (int)ctx->opcode) {
LAB_00b4a847:
          address = (int16_t)offset;
          TVar5 = TCG_COND_EQ;
          goto LAB_00b4a8b8;
        }
        break;
      case 0xe0:
        goto switchD_00b4a389_caseD_f7;
      case 0xe1:
        gen_fcall_save_ctx(ctx);
LAB_00b4a701:
        dest = (offset & 0xf00000U) * 0x100 + (offset & 0xfffffU) * 2;
        goto LAB_00b4a71c;
      default:
        switch(opc) {
        case 0xf6:
          pTVar4 = tcg_ctx->cpu_gpr_d[(uint)r1];
          goto LAB_00b4a8ac;
        case 0xf7:
        case 0xf8:
        case 0xf9:
        case 0xfa:
        case 0xfb:
          goto switchD_00b4a389_caseD_f7;
        case 0xfc:
          offset_00 = offset * 2 + -0x20;
          r2 = r1;
          break;
        case 0xfd:
          if ((int)ctx->opcode < 0) goto LAB_00b4a5be;
          offset_00 = offset * 2;
          break;
        case 0xfe:
          pTVar4 = tcg_ctx->cpu_gpr_d[(uint)r1];
          pTVar3 = tcg_ctx->cpu_gpr_d[0xf];
          offset = offset + 0x10;
          goto LAB_00b4a587;
        case 0xff:
          uVar2 = ctx->opcode;
          if ((int)uVar2 < 0) {
            pTVar4 = tcg_ctx->cpu_gpr_d[(uint)r1];
            TVar5 = TCG_COND_GEU;
LAB_00b4a975:
            constant = uVar2 >> 0xc & 0xf;
          }
          else {
            pTVar4 = tcg_ctx->cpu_gpr_d[(uint)r1];
            TVar5 = TCG_COND_GE;
          }
          goto LAB_00b4a8b8;
        default:
          switch(opc) {
          case 0xbc:
            pTVar4 = tcg_ctx->cpu_gpr_a[(uint)r1];
            break;
          case 0xbd:
            pTVar4 = tcg_ctx->cpu_gpr_a[(uint)r1];
            if ((int)ctx->opcode < 0) goto LAB_00b4a8ac;
            break;
          case 0xbe:
            pTVar4 = tcg_ctx->cpu_gpr_d[(uint)r1];
            pTVar3 = tcg_ctx->cpu_gpr_d[0xf];
            offset = offset + 0x10;
            goto LAB_00b4a75e;
          case 0xbf:
            uVar2 = ctx->opcode;
            if ((int)uVar2 < 0) {
              pTVar4 = tcg_ctx->cpu_gpr_d[(uint)r1];
              TVar5 = TCG_COND_LTU;
              goto LAB_00b4a975;
            }
            pTVar4 = tcg_ctx->cpu_gpr_d[(uint)r1];
            TVar5 = TCG_COND_LT;
            goto LAB_00b4a8b8;
          default:
            if ((opc == 6) || (opc == 9)) {
              local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
              tcg_gen_callN_tricore(tcg_ctx,helper_ret,(TCGTemp *)0x0,1,&local_38);
              goto LAB_00b4a3e1;
            }
            if (opc == 0xe) {
              pTVar4 = tcg_ctx->cpu_gpr_d[(uint)r1];
              TVar5 = TCG_COND_LT;
              goto LAB_00b4a8b2;
            }
            if (opc == 0x1d) goto LAB_00b4a5be;
            if (opc == 0x1e) {
              pTVar4 = tcg_ctx->cpu_gpr_d[0xf];
              goto LAB_00b4a847;
            }
            if (opc == 0x1f) {
              ret = tcg_temp_new_i32(tcg_ctx);
              pTVar3 = tcg_temp_new_i32(tcg_ctx);
              uVar1 = ctx->opcode;
              tcg_gen_mov_i32(tcg_ctx,ret,tcg_ctx->cpu_gpr_d[(uint)r1]);
              tcg_gen_mov_i32(tcg_ctx,pTVar3,tcg_ctx->cpu_gpr_d[(uint)r2]);
              pTVar4 = tcg_ctx->cpu_gpr_d[(uint)r1];
              if ((int)uVar1 < 0) {
                tcg_gen_subi_i32_tricore(tcg_ctx,pTVar4,pTVar4,1);
              }
              else {
                tcg_gen_addi_i32_tricore(tcg_ctx,pTVar4,pTVar4,1);
              }
              gen_branch_cond(ctx,TCG_COND_NE,ret,pTVar3,address);
              tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
            }
            else {
              if (opc != 0x2e) {
                if (opc == 0xee) {
                  pTVar4 = tcg_ctx->cpu_gpr_d[0xf];
                  goto LAB_00b4a8ac;
                }
                if (opc == 0x3e) {
                  pTVar4 = tcg_ctx->cpu_gpr_d[(uint)r1];
                  pTVar3 = tcg_ctx->cpu_gpr_d[0xf];
                  goto LAB_00b4a75e;
                }
                if (opc == 0x3f) {
                  pTVar4 = tcg_ctx->cpu_gpr_d[(uint)r1];
                  pTVar3 = tcg_ctx->cpu_gpr_d[(uint)r2];
                  if ((int)ctx->opcode < 0) {
                    TVar5 = TCG_COND_LTU;
                  }
                  else {
                    TVar5 = TCG_COND_LT;
                  }
                  goto LAB_00b4a764;
                }
                if (opc == 0x4e) {
                  pTVar4 = tcg_ctx->cpu_gpr_d[(uint)r1];
                  TVar5 = TCG_COND_GT;
                }
                else {
                  if (opc != 0x8e) {
                    if (opc != 0x9d) {
                      if (opc == 0x9e) {
                        pTVar4 = tcg_ctx->cpu_gpr_d[0xf];
                        offset = offset + 0x10;
                        goto LAB_00b4a847;
                      }
                      if (opc == 0x9f) {
                        pTVar3 = tcg_temp_new_i32(tcg_ctx);
                        uVar1 = ctx->opcode;
                        tcg_gen_mov_i32(tcg_ctx,pTVar3,tcg_ctx->cpu_gpr_d[(uint)r1]);
                        pTVar4 = tcg_ctx->cpu_gpr_d[(uint)r1];
                        if ((int)uVar1 < 0) {
                          tcg_gen_subi_i32_tricore(tcg_ctx,pTVar4,pTVar4,1);
                        }
                        else {
                          tcg_gen_addi_i32_tricore(tcg_ctx,pTVar4,pTVar4,1);
                        }
                        TVar5 = TCG_COND_NE;
                        goto LAB_00b4a935;
                      }
                      if (opc == 0xae) {
                        pTVar3 = tcg_temp_new_i32(tcg_ctx);
                        tcg_gen_andi_i32_tricore
                                  (tcg_ctx,pTVar3,tcg_ctx->cpu_gpr_d[0xf],
                                   1 << ((byte)constant & 0x1f));
                        TVar5 = TCG_COND_NE;
                        goto LAB_00b4a802;
                      }
                      if (opc == 0xce) {
                        pTVar4 = tcg_ctx->cpu_gpr_d[(uint)r1];
                        TVar5 = TCG_COND_GE;
                        goto LAB_00b4a8b2;
                      }
                      if (opc != 0xed) {
                        if (opc != 0x3c) goto switchD_00b4a389_caseD_f7;
                        goto LAB_00b4a5be;
                      }
                      pTVar4 = tcg_const_i32_tricore(tcg_ctx,ctx->pc_succ_insn);
                      gen_helper_call(tcg_ctx,tcg_ctx->cpu_env,pTVar4);
                      tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
                    }
                    goto LAB_00b4a701;
                  }
                  pTVar4 = tcg_ctx->cpu_gpr_d[(uint)r1];
                  TVar5 = TCG_COND_LE;
                }
                goto LAB_00b4a8b2;
              }
              pTVar3 = tcg_temp_new_i32(tcg_ctx);
              tcg_gen_andi_i32_tricore
                        (tcg_ctx,pTVar3,tcg_ctx->cpu_gpr_d[0xf],1 << ((byte)constant & 0x1f));
              TVar5 = TCG_COND_EQ;
LAB_00b4a802:
              gen_branch_condi(ctx,TVar5,pTVar3,0,address);
            }
LAB_00b4a943:
            tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
            goto LAB_00b4a948;
          }
          goto LAB_00b4a8a4;
        }
        gen_loop(ctx,r2,offset_00);
        goto LAB_00b4a948;
      }
LAB_00b4a4dd:
      address = (int16_t)offset;
      TVar5 = TCG_COND_NE;
LAB_00b4a8b8:
      gen_branch_condi(ctx,TVar5,pTVar4,constant,address);
      goto LAB_00b4a948;
    }
LAB_00b4a587:
    address = (int16_t)offset;
    TVar5 = TCG_COND_NE;
LAB_00b4a764:
    gen_branch_cond(ctx,TVar5,pTVar4,pTVar3,address);
    goto LAB_00b4a948;
  }
LAB_00b4a5be:
  dest = offset * 2 + (ctx->base).pc_next;
LAB_00b4a71c:
  gen_goto_tb(ctx,0,dest);
LAB_00b4a948:
  (ctx->base).is_jmp = DISAS_NORETURN;
  return;
}

Assistant:

static void gen_compute_branch(DisasContext *ctx, uint32_t opc,
                               int insn_bytes,
                               int rs, int rt, int32_t offset,
                               int delayslot_size)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    target_ulong btgt = -1;
    int blink = 0;
    int bcond_compute = 0;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);

    if (ctx->hflags & MIPS_HFLAG_BMASK) {
#ifdef MIPS_DEBUG_DISAS
        LOG_DISAS("Branch in delay / forbidden slot at PC 0x"
                  TARGET_FMT_lx "\n", ctx->base.pc_next);
#endif
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }

    /* Load needed operands */
    switch (opc) {
    case OPC_BEQ:
    case OPC_BEQL:
    case OPC_BNE:
    case OPC_BNEL:
        /* Compare two registers */
        if (rs != rt) {
            gen_load_gpr(tcg_ctx, t0, rs);
            gen_load_gpr(tcg_ctx, t1, rt);
            bcond_compute = 1;
        }
        btgt = ctx->base.pc_next + insn_bytes + offset;
        break;
    case OPC_BGEZ:
    case OPC_BGEZAL:
    case OPC_BGEZALL:
    case OPC_BGEZL:
    case OPC_BGTZ:
    case OPC_BGTZL:
    case OPC_BLEZ:
    case OPC_BLEZL:
    case OPC_BLTZ:
    case OPC_BLTZAL:
    case OPC_BLTZALL:
    case OPC_BLTZL:
        /* Compare to zero */
        if (rs != 0) {
            gen_load_gpr(tcg_ctx, t0, rs);
            bcond_compute = 1;
        }
        btgt = ctx->base.pc_next + insn_bytes + offset;
        break;
    case OPC_BPOSGE32:
#if defined(TARGET_MIPS64)
    case OPC_BPOSGE64:
        tcg_gen_andi_tl(tcg_ctx, t0, tcg_ctx->cpu_dspctrl, 0x7F);
#else
        tcg_gen_andi_tl(tcg_ctx, t0, tcg_ctx->cpu_dspctrl, 0x3F);
#endif
        bcond_compute = 1;
        btgt = ctx->base.pc_next + insn_bytes + offset;
        break;
    case OPC_J:
    case OPC_JAL:
    case OPC_JALX:
        /* Jump to immediate */
        btgt = ((ctx->base.pc_next + insn_bytes) & (int32_t)0xF0000000) |
            (uint32_t)offset;
        break;
    case OPC_JR:
    case OPC_JALR:
        /* Jump to register */
        if (offset != 0 && offset != 16) {
            /*
             * Hint = 0 is JR/JALR, hint 16 is JR.HB/JALR.HB, the
             * others are reserved.
             */
            MIPS_INVAL("jump hint");
            generate_exception_end(ctx, EXCP_RI);
            goto out;
        }
        gen_load_gpr(tcg_ctx, tcg_ctx->btarget, rs);
        break;
    default:
        MIPS_INVAL("branch/jump");
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }
    if (bcond_compute == 0) {
        /* No condition to be computed */
        switch (opc) {
        case OPC_BEQ:     /* rx == rx        */
        case OPC_BEQL:    /* rx == rx likely */
        case OPC_BGEZ:    /* 0 >= 0          */
        case OPC_BGEZL:   /* 0 >= 0 likely   */
        case OPC_BLEZ:    /* 0 <= 0          */
        case OPC_BLEZL:   /* 0 <= 0 likely   */
            /* Always take */
            ctx->hflags |= MIPS_HFLAG_B;
            break;
        case OPC_BGEZAL:  /* 0 >= 0          */
        case OPC_BGEZALL: /* 0 >= 0 likely   */
            /* Always take and link */
            blink = 31;
            ctx->hflags |= MIPS_HFLAG_B;
            break;
        case OPC_BNE:     /* rx != rx        */
        case OPC_BGTZ:    /* 0 > 0           */
        case OPC_BLTZ:    /* 0 < 0           */
            /* Treat as NOP. */
            goto out;
        case OPC_BLTZAL:  /* 0 < 0           */
            /*
             * Handle as an unconditional branch to get correct delay
             * slot checking.
             */
            blink = 31;
            btgt = ctx->base.pc_next + insn_bytes + delayslot_size;
            ctx->hflags |= MIPS_HFLAG_B;
            break;
        case OPC_BLTZALL: /* 0 < 0 likely */
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[31], ctx->base.pc_next + 8);
            /* Skip the instruction in the delay slot */
            ctx->base.pc_next += 4;
            goto out;
        case OPC_BNEL:    /* rx != rx likely */
        case OPC_BGTZL:   /* 0 > 0 likely */
        case OPC_BLTZL:   /* 0 < 0 likely */
            /* Skip the instruction in the delay slot */
            ctx->base.pc_next += 4;
            goto out;
        case OPC_J:
            ctx->hflags |= MIPS_HFLAG_B;
            break;
        case OPC_JALX:
            ctx->hflags |= MIPS_HFLAG_BX;
            /* Fallthrough */
        case OPC_JAL:
            blink = 31;
            ctx->hflags |= MIPS_HFLAG_B;
            break;
        case OPC_JR:
            ctx->hflags |= MIPS_HFLAG_BR;
            break;
        case OPC_JALR:
            blink = rt;
            ctx->hflags |= MIPS_HFLAG_BR;
            break;
        default:
            MIPS_INVAL("branch/jump");
            generate_exception_end(ctx, EXCP_RI);
            goto out;
        }
    } else {
        switch (opc) {
        case OPC_BEQ:
            tcg_gen_setcond_tl(tcg_ctx, TCG_COND_EQ, tcg_ctx->bcond, t0, t1);
            goto not_likely;
        case OPC_BEQL:
            tcg_gen_setcond_tl(tcg_ctx, TCG_COND_EQ, tcg_ctx->bcond, t0, t1);
            goto likely;
        case OPC_BNE:
            tcg_gen_setcond_tl(tcg_ctx, TCG_COND_NE, tcg_ctx->bcond, t0, t1);
            goto not_likely;
        case OPC_BNEL:
            tcg_gen_setcond_tl(tcg_ctx, TCG_COND_NE, tcg_ctx->bcond, t0, t1);
            goto likely;
        case OPC_BGEZ:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_GE, tcg_ctx->bcond, t0, 0);
            goto not_likely;
        case OPC_BGEZL:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_GE, tcg_ctx->bcond, t0, 0);
            goto likely;
        case OPC_BGEZAL:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_GE, tcg_ctx->bcond, t0, 0);
            blink = 31;
            goto not_likely;
        case OPC_BGEZALL:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_GE, tcg_ctx->bcond, t0, 0);
            blink = 31;
            goto likely;
        case OPC_BGTZ:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_GT, tcg_ctx->bcond, t0, 0);
            goto not_likely;
        case OPC_BGTZL:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_GT, tcg_ctx->bcond, t0, 0);
            goto likely;
        case OPC_BLEZ:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_LE, tcg_ctx->bcond, t0, 0);
            goto not_likely;
        case OPC_BLEZL:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_LE, tcg_ctx->bcond, t0, 0);
            goto likely;
        case OPC_BLTZ:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_LT, tcg_ctx->bcond, t0, 0);
            goto not_likely;
        case OPC_BLTZL:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_LT, tcg_ctx->bcond, t0, 0);
            goto likely;
        case OPC_BPOSGE32:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_GE, tcg_ctx->bcond, t0, 32);
            goto not_likely;
#if defined(TARGET_MIPS64)
        case OPC_BPOSGE64:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_GE, tcg_ctx->bcond, t0, 64);
            goto not_likely;
#endif
        case OPC_BLTZAL:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_LT, tcg_ctx->bcond, t0, 0);
            blink = 31;
        not_likely:
            ctx->hflags |= MIPS_HFLAG_BC;
            break;
        case OPC_BLTZALL:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_LT, tcg_ctx->bcond, t0, 0);
            blink = 31;
        likely:
            ctx->hflags |= MIPS_HFLAG_BL;
            break;
        default:
            MIPS_INVAL("conditional branch/jump");
            generate_exception_end(ctx, EXCP_RI);
            goto out;
        }
    }

    ctx->btarget = btgt;

    switch (delayslot_size) {
    case 2:
        ctx->hflags |= MIPS_HFLAG_BDS16;
        break;
    case 4:
        ctx->hflags |= MIPS_HFLAG_BDS32;
        break;
    }

    if (blink > 0) {
        int post_delay = insn_bytes + delayslot_size;
        int lowbit = !!(ctx->hflags & MIPS_HFLAG_M16);

        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[blink],
                        ctx->base.pc_next + post_delay + lowbit);
    }

 out:
    if (insn_bytes == 2) {
        ctx->hflags |= MIPS_HFLAG_B16;
    }
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}